

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

QString * __thiscall
QTzTimeZonePrivate::displayName
          (QString *__return_storage_ptr__,QTzTimeZonePrivate *this,TimeType timeType,
          NameType nameType,QLocale *locale)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Data tran;
  undefined1 local_68 [40];
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((nameType != LongName) && (bVar1 = QTimeZonePrivate::isAnglicLocale(locale), bVar1)) {
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    data((Data *)local_68,this,timeType);
    if (nameType == ShortName) {
      (__return_storage_ptr__->d).d = (Data *)local_68._0_8_;
      (__return_storage_ptr__->d).ptr = (char16_t *)local_68._8_8_;
      (__return_storage_ptr__->d).size = local_68._16_8_;
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_68._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_68._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
LAB_0040a643:
      bVar1 = false;
    }
    else {
      bVar2 = QTimeZonePrivate::isAnglicLocale(locale);
      bVar1 = true;
      if (bVar2) {
        QTimeZonePrivate::isoOffsetFormat(__return_storage_ptr__,local_68._32_4_,OffsetName);
        goto LAB_0040a643;
      }
    }
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    if (!bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_0040a6b1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QTimeZonePrivate::displayName
              (__return_storage_ptr__,&this->super_QTimeZonePrivate,timeType,nameType,locale);
    return __return_storage_ptr__;
  }
LAB_0040a6b1:
  __stack_chk_fail();
}

Assistant:

QString QTzTimeZonePrivate::displayName(QTimeZone::TimeType timeType,
                                        QTimeZone::NameType nameType,
                                        const QLocale &locale) const
{
    // TZ only provides C-locale abbreviations and offset:
    if (nameType != QTimeZone::LongName && isDataLocale(locale)) {
        Data tran = data(timeType);
        if (tran.atMSecsSinceEpoch != invalidMSecs()) {
            if (nameType == QTimeZone::ShortName)
                return tran.abbreviation;
            // Save base class repeating the data(timeType) query:
            if (isAnglicLocale(locale))
                return isoOffsetFormat(tran.offsetFromUtc);
        }
    }
    // Otherwise, fall back to base class (and qtimezonelocale.cpp):
    return QTimeZonePrivate::displayName(timeType, nameType, locale);
}